

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

int compare_nof_true_bits(void *aptr,void *bptr)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (*(uint *)((long)aptr + 8) & 0x5555) + (*(uint *)((long)aptr + 8) >> 1 & 0x5555);
  uVar1 = (uVar1 & 0x3333) + (uVar1 >> 2 & 0x3333);
  uVar2 = (uVar1 & 0x707) + (uVar1 >> 4 & 0x707);
  uVar1 = (*(uint *)((long)bptr + 8) & 0x5555) + (*(uint *)((long)bptr + 8) >> 1 & 0x5555);
  uVar1 = (uVar1 & 0x3333) + (uVar1 >> 2 & 0x3333);
  uVar1 = (uVar1 & 0x707) + (uVar1 >> 4 & 0x707);
  return ((uVar1 & 0xff) - ((uVar2 & 0xff) + (uVar2 >> 8))) + (uVar1 >> 8);
}

Assistant:

static int DECL_SPEC compare_nof_true_bits(const void *aptr, const void *bptr)
{
	uint a = ((const opcode_struct*)aptr)->mask;
	uint b = ((const opcode_struct*)bptr)->mask;

	a = ((a & 0xAAAA) >> 1) + (a & 0x5555);
	a = ((a & 0xCCCC) >> 2) + (a & 0x3333);
	a = ((a & 0xF0F0) >> 4) + (a & 0x0F0F);
	a = ((a & 0xFF00) >> 8) + (a & 0x00FF);

	b = ((b & 0xAAAA) >> 1) + (b & 0x5555);
	b = ((b & 0xCCCC) >> 2) + (b & 0x3333);
	b = ((b & 0xF0F0) >> 4) + (b & 0x0F0F);
	b = ((b & 0xFF00) >> 8) + (b & 0x00FF);

	return b - a; /* reversed to get greatest to least sorting */
}